

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMA_CC_Unmarshal(TPMA_CC *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMA_CC *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal((UINT32 *)target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (((uint)*target & 0xc03f0000) == 0) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0xa1;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMA_CC_Unmarshal(TPMA_CC *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_CC_Unmarshal((TPM_CC *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT32 *)target) & (UINT32)0xc03f0000)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}